

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference.cpp
# Opt level: O2

void __thiscall C_A_T_C_H_T_E_S_T_10::foo::func(foo *this,int i)

{
  int local_c0;
  int i_local;
  SourceLineInfo local_b8;
  BinaryExpr<const_int_&,_const_int_&> local_a8;
  AssertionHandler catchAssertionHandler;
  StringRef local_30;
  
  local_a8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
  local_a8.super_ITransientExpression.m_isBinaryExpression = true;
  local_a8.super_ITransientExpression.m_result = false;
  local_a8.super_ITransientExpression._10_6_ = 0;
  local_b8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/reference.cpp";
  local_b8.line = 0x129;
  i_local = i;
  Catch::StringRef::StringRef(&local_30,"i == 0");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_a8,&local_b8,local_30,Normal);
  local_c0 = 0;
  local_b8.file = (char *)&i_local;
  Catch::ExprLhs<int_const&>::operator==(&local_a8,(ExprLhs<int_const&> *)&local_b8,&local_c0);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_a8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_a8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void func(int i)
            {
                REQUIRE(i == 0);
            }